

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void float_tif_to_float<float>
               (uint32_t width,uint32_t height,uint16_t spp,uint16_t config,TIFF *tif,
               vector<float,_std::allocator<float>_> *output_buffer)

{
  value_type vVar1;
  undefined8 uVar2;
  long lVar3;
  reference pvVar4;
  runtime_error *this;
  uint local_5c;
  uint32_t x_1;
  float *scanline_1;
  ushort local_48;
  ushort local_46;
  uint32_t y_1;
  uint16_t c_1;
  uint16_t c;
  uint32_t x;
  float *scanline;
  uint32_t y;
  tdata_t buf;
  vector<float,_std::allocator<float>_> *output_buffer_local;
  TIFF *tif_local;
  uint16_t config_local;
  uint16_t spp_local;
  uint32_t height_local;
  uint32_t width_local;
  
  uVar2 = TIFFScanlineSize(tif);
  lVar3 = _TIFFmalloc(uVar2);
  std::vector<float,_std::allocator<float>_>::resize
            (output_buffer,(ulong)(width * height * (uint)spp));
  if (config == 1) {
    for (scanline._4_4_ = 0; scanline._4_4_ < height; scanline._4_4_ = scanline._4_4_ + 1) {
      TIFFReadScanline(tif,lVar3,scanline._4_4_,0);
      for (y_1 = 0; y_1 < width; y_1 = y_1 + 1) {
        for (local_46 = 0; local_46 < spp; local_46 = local_46 + 1) {
          vVar1 = *(value_type *)(lVar3 + (ulong)(spp * y_1 + (uint)local_46) * 4);
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                             (output_buffer,
                              (ulong)((uint)spp * (scanline._4_4_ * width + y_1) + (uint)local_46));
          *pvVar4 = vVar1;
        }
      }
    }
  }
  else {
    if (config != 2) {
      _TIFFfree(lVar3);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid planar config");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    for (local_48 = 0; local_48 < spp; local_48 = local_48 + 1) {
      for (scanline_1._4_4_ = 0; scanline_1._4_4_ < height; scanline_1._4_4_ = scanline_1._4_4_ + 1)
      {
        TIFFReadScanline(tif,lVar3,scanline_1._4_4_,local_48);
        for (local_5c = 0; local_5c < width; local_5c = local_5c + 1) {
          vVar1 = *(value_type *)(lVar3 + (ulong)local_5c * 4);
          pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                             (output_buffer,
                              (ulong)((uint)spp * (scanline_1._4_4_ * width + local_5c) +
                                     (uint)local_48));
          *pvVar4 = vVar1;
        }
      }
    }
  }
  _TIFFfree(lVar3);
  return;
}

Assistant:

void float_tif_to_float(
    uint32_t width, uint32_t height,
    uint16_t spp,
    uint16_t config,
    TIFF* tif,
    std::vector<float>& output_buffer)
{
    tdata_t buf;
    buf = _TIFFmalloc(TIFFScanlineSize(tif));

    output_buffer.resize(width * height * spp);

    switch (config) {
        case PLANARCONFIG_CONTIG:
            for (uint32_t y = 0; y < height; y++) {
                TIFFReadScanline(tif, buf, y, 0);
                T* scanline = (T*)buf;

                for (uint32_t x = 0; x < width; x++) {
                    for (uint16_t c = 0;  c < spp; c++) {
                        output_buffer[spp * (y * width + x) + c] = (float)scanline[spp * x + c];
                    }
                }
            }
            break;

        // TODO: This is untested code!
        case PLANARCONFIG_SEPARATE:
            for (uint16_t c = 0;  c < spp; c++) {
                for (uint32_t y = 0; y < height; y++) {
                    TIFFReadScanline(tif, buf, y, c);
                    T* scanline = (T*)buf;

                    for (uint32_t x = 0; x < width; x++) {
                        output_buffer[spp * (y * width + x) + c] = (float)scanline[x];
                    }
                }
            }
            break;

        default:
            _TIFFfree(buf);
            throw std::runtime_error("Invalid planar config");

    }

    _TIFFfree(buf);
}